

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ushort uVar1;
  ZSTD_dStage ZVar2;
  void *pvVar3;
  XXH64_hash_t XVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long_long uVar7;
  uint3 uVar8;
  ulong uVar9;
  xxh_u64 xVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  blockType_e bVar14;
  long lVar15;
  size_t err_code;
  
  ZVar2 = dctx->stage;
  if (ZVar2 - ZSTDds_decompressBlock < 2) {
    uVar9 = dctx->expected;
    uVar12 = uVar9;
    if (dctx->bType == bt_raw) {
      sVar11 = srcSize;
      if (uVar9 < srcSize) {
        sVar11 = uVar9;
      }
      uVar12 = sVar11 + (sVar11 == 0);
    }
  }
  else {
    uVar9 = dctx->expected;
    uVar12 = uVar9;
  }
  if (uVar12 != srcSize) {
    return 0xffffffffffffffb8;
  }
  pvVar3 = dctx->previousDstEnd;
  if (dstCapacity != 0 && pvVar3 != dst) {
    dctx->dictEnd = pvVar3;
    dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar3) + (long)dst);
    dctx->prefixStart = dst;
    dctx->previousDstEnd = dst;
  }
  dctx->processedCSize = dctx->processedCSize + srcSize;
  if (ZSTDds_skipFrame < ZVar2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa0c5,
                  "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                 );
  }
  uVar12 = (long)&switchD_00194405::switchdataD_002fa684 +
           (long)(int)(&switchD_00194405::switchdataD_002fa684)[ZVar2];
  switch(ZVar2) {
  case ZSTDds_getFrameHeaderSize:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa039,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if (dctx->format == ZSTD_f_zstd1) {
      if (srcSize < 4) {
        __assert_fail("srcSize >= ZSTD_FRAMEIDSIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa03b,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        memcpy(dctx->headerBuffer,src,srcSize);
        dctx->expected = 8 - srcSize;
        dctx->stage = ZSTDds_decodeSkippableHeader;
        return 0;
      }
    }
    sVar11 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
    dctx->headerSize = sVar11;
    if (0xffffffffffffff88 < sVar11) {
      return sVar11;
    }
    memcpy(dctx->headerBuffer,src,srcSize);
    dctx->expected = sVar11 - srcSize;
    dctx->stage = ZSTDds_decodeFrameHeader;
    break;
  case ZSTDds_decodeFrameHeader:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa04a,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x176c4),src,srcSize);
    sVar11 = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
    if (0xffffffffffffff88 < sVar11) {
      return sVar11;
    }
LAB_001945cf:
    dctx->expected = 3;
    dctx->stage = ZSTDds_decodeBlockHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    uVar1 = *src;
    uVar8 = *src;
    uVar13 = (uint)(uVar8 >> 3);
    bVar14 = uVar1 >> 1 & bt_reserved;
    if (bVar14 == bt_rle) {
      if ((dctx->fParams).blockSizeMax == 0) {
        return 0xffffffffffffffec;
      }
      dctx->expected = 1;
      dctx->bType = bt_rle;
      dctx->rleSize = (ulong)uVar13;
    }
    else {
      if (bVar14 == bt_reserved) {
        return 0xffffffffffffffec;
      }
      if ((dctx->fParams).blockSizeMax < uVar13) {
        return 0xffffffffffffffec;
      }
      dctx->expected = (ulong)uVar13;
      dctx->bType = bVar14;
      dctx->rleSize = (ulong)uVar13;
      if (uVar8 < 8) {
        if ((uVar1 & 1) != 0) {
          if ((dctx->fParams).checksumFlag != 0) {
            dctx->expected = 4;
            dctx->stage = ZSTDds_checkChecksum;
            return 0;
          }
          goto switchD_00194405_caseD_7;
        }
        goto LAB_001945cf;
      }
    }
    dctx->stage = (uVar1 & 1) + ZSTDds_decompressBlock;
    break;
  default:
    bVar14 = dctx->bType;
    if (bVar14 == bt_raw) {
      if (uVar9 < srcSize) {
        __assert_fail("srcSize <= dctx->expected",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa079,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if (dstCapacity < srcSize) {
        return 0xffffffffffffffba;
      }
      if (dst == (void *)0x0) {
        if (srcSize != 0) {
          return 0xffffffffffffffb6;
        }
      }
      else {
        memmove(dst,src,srcSize);
        if (0xffffffffffffff88 < srcSize) {
          return srcSize;
        }
      }
      sVar11 = dctx->expected - srcSize;
      dctx->expected = sVar11;
    }
    else {
      if (bVar14 == bt_rle) {
        uVar9 = dctx->rleSize;
        srcSize = 0xffffffffffffffba;
        if (uVar9 <= dstCapacity) {
          if (dst == (void *)0x0) {
            srcSize = 0xffffffffffffffb6;
            if (uVar9 == 0) {
              srcSize = uVar9;
            }
          }
          else {
            memset(dst,(uint)*src,uVar9);
            srcSize = uVar9;
          }
        }
      }
      else {
        if (bVar14 != bt_compressed) {
          return 0xffffffffffffffec;
        }
        srcSize = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1,is_streaming);
      }
      dctx->expected = 0;
      if (0xffffffffffffff88 < srcSize) {
        return srcSize;
      }
      sVar11 = 0;
    }
    if ((dctx->fParams).blockSizeMax < srcSize) {
      return 0xffffffffffffffec;
    }
    dctx->decodedSize = dctx->decodedSize + srcSize;
    if (dctx->validateChecksum != 0) {
      XXH_INLINE_XXH64_update(&dctx->xxhState,dst,srcSize);
      sVar11 = dctx->expected;
    }
    dctx->previousDstEnd = (void *)((long)dst + srcSize);
    if (sVar11 == 0) {
      if (dctx->stage != ZSTDds_decompressLastBlock) {
        dctx->stage = ZSTDds_decodeBlockHeader;
        dctx->expected = 3;
        return srcSize;
      }
      uVar7 = (dctx->fParams).frameContentSize;
      if ((uVar7 != 0xffffffffffffffff) && (dctx->decodedSize != uVar7)) {
        return 0xffffffffffffffec;
      }
      if ((dctx->fParams).checksumFlag == 0) {
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return srcSize;
      }
      dctx->expected = 4;
      dctx->stage = ZSTDds_checkChecksum;
      return srcSize;
    }
    return srcSize;
  case ZSTDds_checkChecksum:
    if (srcSize != 4) {
      __assert_fail("srcSize == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0a9,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if (dctx->validateChecksum != 0) {
      uVar9 = (dctx->xxhState).total_len;
      if (uVar9 < 0x20) {
        lVar15 = (dctx->xxhState).v[2] + 0x27d4eb2f165667c5;
      }
      else {
        XVar4 = (dctx->xxhState).v[0];
        uVar12 = (dctx->xxhState).v[1];
        uVar5 = (dctx->xxhState).v[2];
        uVar6 = (dctx->xxhState).v[3];
        uVar12 = ((uVar12 * -0x6c158a5880000000 | uVar12 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((XVar4 * -0x6c158a5880000000 | XVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 (uVar6 << 0x12 | uVar6 >> 0x2e) + (uVar5 << 0xc | uVar5 >> 0x34) +
                 (uVar12 << 7 | uVar12 >> 0x39) + (XVar4 << 1 | (ulong)((long)XVar4 < 0))) *
                 -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                 0x85ebca77c2b2ae63;
        lVar15 = ((uVar6 * -0x6c158a5880000000 | uVar6 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((uVar5 * -0x6c158a5880000000 | uVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^ uVar12) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
                 -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      }
      xVar10 = XXH64_finalize(lVar15 + uVar9,(xxh_u8 *)(dctx->xxhState).mem64,uVar9,
                              (XXH_alignment)uVar12);
      if (*src != (int)xVar10) {
        return 0xffffffffffffffea;
      }
    }
  case ZSTDds_skipFrame:
switchD_00194405_caseD_7:
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    break;
  case ZSTDds_decodeSkippableHeader:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0b8,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if (8 < srcSize) {
      __assert_fail("srcSize <= ZSTD_SKIPPABLEHEADERSIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0b9,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    memcpy((void *)((long)dctx + (0x176cc - srcSize)),src,srcSize);
    dctx->expected = (ulong)*(uint *)(dctx->headerBuffer + 4);
    dctx->stage = ZSTDds_skipFrame;
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    RETURN_ERROR_IF(srcSize != ZSTD_nextSrcSizeToDecompressWithInputSize(dctx, srcSize), srcSize_wrong, "not allowed");
    ZSTD_checkContinuity(dctx, dst, dstCapacity);

    dctx->processedCSize += srcSize;

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        ZSTD_memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize), "");
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            RETURN_ERROR_IF(cBlockSize > dctx->fParams.blockSizeMax, corruption_detected, "Block Size Exceeds Maximum");
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1, is_streaming);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_raw :
                assert(srcSize <= dctx->expected);
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                FORWARD_IF_ERROR(rSize, "ZSTD_copyRawBlock failed");
                assert(rSize == srcSize);
                dctx->expected -= rSize;
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_reserved :   /* should never happen */
            default:
                RETURN_ERROR(corruption_detected, "invalid block type");
            }
            FORWARD_IF_ERROR(rSize, "");
            RETURN_ERROR_IF(rSize > dctx->fParams.blockSizeMax, corruption_detected, "Decompressed Block Size Exceeds Maximum");
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->validateChecksum) XXH64_update(&dctx->xxhState, dst, rSize);
            dctx->previousDstEnd = (char*)dst + rSize;

            /* Stay on the same stage until we are finished streaming the block. */
            if (dctx->expected > 0) {
                return rSize;
            }

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                RETURN_ERROR_IF(
                    dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                 && dctx->decodedSize != dctx->fParams.frameContentSize,
                    corruption_detected, "");
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {
            if (dctx->validateChecksum) {
                U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
                U32 const check32 = MEM_readLE32(src);
                DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
                RETURN_ERROR_IF(check32 != h32, checksum_wrong, "");
            }
            ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        ZSTD_memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }
}